

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O1

void * metacallt(char *name,metacall_value_id *ids,...)

{
  char in_AL;
  type_id tVar1;
  metacall_value_id id;
  loader_data v;
  function_conflict func;
  signature s;
  size_t size;
  type t;
  value pvVar2;
  char *pcVar3;
  void *pvVar4;
  undefined8 *puVar5;
  size_t length;
  function_return pvVar6;
  undefined8 in_RCX;
  ulong uVar7;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t sVar8;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  void *args [16];
  undefined8 local_188;
  undefined8 *local_180;
  undefined8 local_168 [4];
  undefined8 local_148;
  undefined8 local_140;
  undefined4 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  void *local_b8 [17];
  
  if (in_AL != '\0') {
    local_138 = in_XMM0_Da;
    local_128 = in_XMM1_Qa;
    local_118 = in_XMM2_Qa;
    local_108 = in_XMM3_Qa;
    local_f8 = in_XMM4_Qa;
    local_e8 = in_XMM5_Qa;
    local_d8 = in_XMM6_Qa;
    local_c8 = in_XMM7_Qa;
  }
  local_168[2] = in_RDX;
  local_168[3] = in_RCX;
  local_148 = in_R8;
  local_140 = in_R9;
  v = loader_get(name);
  tVar1 = value_type_id(v);
  if (tVar1 == 0xd) {
    func = value_to_function(v);
  }
  else {
    func = (function_conflict)0x0;
  }
  if (func == (function_conflict)0x0) {
    pvVar6 = (function_return)0x0;
  }
  else {
    s = function_signature(func);
    size = signature_count(s);
    local_180 = (undefined8 *)&stack0x00000008;
    local_188 = 0x3000000010;
    if (size != 0) {
      sVar8 = 0;
      do {
        t = signature_get_type(s,sVar8);
        type_index(t);
        if (t == (type)0x0) {
          id = ids[sVar8];
        }
        else {
          id = type_index(t);
        }
        switch(id) {
        case METACALL_BOOL:
          if ((uint)local_188 < 0x29) {
            local_188 = CONCAT44(local_188._4_4_,(uint)local_188 + 8);
          }
          else {
            local_180 = local_180 + 1;
          }
          pvVar2 = value_create_bool('\0');
          local_b8[sVar8] = pvVar2;
          switch(id) {
          case METACALL_CHAR:
            goto switchD_00125f42_caseD_1;
          case METACALL_SHORT:
            goto switchD_00125f42_caseD_2;
          case METACALL_INT:
            goto switchD_00125f42_caseD_3;
          case METACALL_LONG:
            goto switchD_00125f42_caseD_4;
          case METACALL_FLOAT:
            goto switchD_00125f42_caseD_5;
          case METACALL_DOUBLE:
            goto switchD_00125f42_caseD_6;
          case METACALL_STRING:
            goto switchD_00125f42_caseD_7;
          default:
            goto switchD_00125f42_caseD_8;
          case METACALL_PTR:
            goto switchD_00125f42_caseD_b;
          }
        case METACALL_CHAR:
switchD_00125f42_caseD_1:
          if ((uint)local_188 < 0x29) {
            local_188 = CONCAT44(local_188._4_4_,(uint)local_188 + 8);
          }
          else {
            local_180 = local_180 + 1;
          }
          pvVar4 = value_create_char('\0');
          break;
        case METACALL_SHORT:
switchD_00125f42_caseD_2:
          if ((uint)local_188 < 0x29) {
            local_188 = CONCAT44(local_188._4_4_,(uint)local_188 + 8);
          }
          else {
            local_180 = local_180 + 1;
          }
          pvVar4 = value_create_short(0);
          break;
        case METACALL_INT:
switchD_00125f42_caseD_3:
          if ((uint)local_188 < 0x29) {
            local_188 = CONCAT44(local_188._4_4_,(uint)local_188 + 8);
          }
          else {
            local_180 = local_180 + 1;
          }
          pvVar4 = value_create_int(0);
          break;
        case METACALL_LONG:
switchD_00125f42_caseD_4:
          if ((uint)local_188 < 0x29) {
            local_188 = CONCAT44(local_188._4_4_,(uint)local_188 + 8);
          }
          else {
            local_180 = local_180 + 1;
          }
          pvVar4 = value_create_long(0x1261af);
          break;
        case METACALL_FLOAT:
switchD_00125f42_caseD_5:
          if (local_188._4_4_ < 0xa1) {
            local_188 = CONCAT44(local_188._4_4_ + 0x10,(uint)local_188);
          }
          else {
            local_180 = local_180 + 1;
          }
          pvVar4 = value_create_float(0.0);
          break;
        case METACALL_DOUBLE:
switchD_00125f42_caseD_6:
          if (local_188._4_4_ < 0xa1) {
            local_188 = CONCAT44(local_188._4_4_ + 0x10,(uint)local_188);
          }
          else {
            local_180 = local_180 + 1;
          }
          pvVar4 = value_create_double(5.95096635693677e-318);
          break;
        case METACALL_STRING:
switchD_00125f42_caseD_7:
          uVar7 = local_188 & 0xffffffff;
          if (uVar7 < 0x29) {
            local_188 = CONCAT44(local_188._4_4_,(uint)local_188 + 8);
            puVar5 = (undefined8 *)((long)local_168 + uVar7);
          }
          else {
            puVar5 = local_180;
            local_180 = local_180 + 1;
          }
          pcVar3 = (char *)*puVar5;
          length = strlen(pcVar3);
          pvVar4 = value_create_string(pcVar3,length);
          break;
        default:
switchD_00125f42_caseD_8:
          pcVar3 = type_id_name(id);
          log_write_impl_va("metacall",0x2e6,"metacallt",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                            ,LOG_LEVEL_ERROR,
                            "Calling metacallt with unsupported type \'%s\', using null type instead"
                            ,pcVar3);
          pvVar4 = metacall_value_create_null();
          break;
        case METACALL_PTR:
switchD_00125f42_caseD_b:
          if ((uint)local_188 < 0x29) {
            local_188 = CONCAT44(local_188._4_4_,(uint)local_188 + 8);
          }
          else {
            local_180 = local_180 + 1;
          }
          pvVar4 = value_create_ptr((void *)0x126197);
        }
        local_b8[sVar8] = pvVar4;
        sVar8 = sVar8 + 1;
      } while (size != sVar8);
    }
    pvVar6 = function_call(func,local_b8,size);
    if (size != 0) {
      sVar8 = 0;
      do {
        value_type_destroy(local_b8[sVar8]);
        sVar8 = sVar8 + 1;
      } while (size != sVar8);
    }
  }
  return pvVar6;
}

Assistant:

void *metacallt(const char *name, const enum metacall_value_id ids[], ...)
{
	value f_val = loader_get(name);
	function f = NULL;

	if (value_type_id(f_val) == TYPE_FUNCTION)
	{
		f = value_to_function(f_val);
	}

	if (f != NULL)
	{
		void *args[METACALL_ARGS_SIZE];

		value ret = NULL;

		signature s = function_signature(f);

		size_t iterator, args_count = signature_count(s);

		va_list va;

		va_start(va, ids);

		for (iterator = 0; iterator < args_count; ++iterator)
		{
			type t = signature_get_type(s, iterator);

			type_id id = type_index(t);

			if (t != NULL)
			{
				id = type_index(t);
			}
			else
			{
				id = ids[iterator];
			}

			if (id == TYPE_BOOL)
			{
				args[iterator] = value_create_bool((boolean)va_arg(va, unsigned int));
			}
			if (id == TYPE_CHAR)
			{
				args[iterator] = value_create_char((char)va_arg(va, int));
			}
			else if (id == TYPE_SHORT)
			{
				args[iterator] = value_create_short((short)va_arg(va, int));
			}
			else if (id == TYPE_INT)
			{
				args[iterator] = value_create_int(va_arg(va, int));
			}
			else if (id == TYPE_LONG)
			{
				args[iterator] = value_create_long(va_arg(va, long));
			}
			else if (id == TYPE_FLOAT)
			{
				args[iterator] = value_create_float((float)va_arg(va, double));
			}
			else if (id == TYPE_DOUBLE)
			{
				args[iterator] = value_create_double(va_arg(va, double));
			}
			else if (id == TYPE_STRING)
			{
				const char *str = va_arg(va, const char *);

				args[iterator] = value_create_string(str, strlen(str));
			}
			else if (id == TYPE_PTR)
			{
				args[iterator] = value_create_ptr(va_arg(va, const void *));
			}
			else
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Calling metacallt with unsupported type '%s', using null type instead", type_id_name(id));
				args[iterator] = metacall_value_create_null();
			}
		}

		va_end(va);

		ret = function_call(f, args, args_count);

		for (iterator = 0; iterator < args_count; ++iterator)
		{
			value_type_destroy(args[iterator]);
		}

		return ret;
	}

	return NULL;
}